

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Close(PosixWritableFile *this)

{
  bool bVar1;
  int *piVar2;
  long in_RSI;
  Status local_28;
  int local_20;
  undefined1 local_19;
  int close_result;
  PosixWritableFile *this_local;
  Status *status;
  
  local_19 = 0;
  this_local = this;
  FlushBuffer(this);
  local_20 = close(*(int *)(in_RSI + 0x10010));
  if ((local_20 < 0) && (bVar1 = Status::ok((Status *)this), bVar1)) {
    piVar2 = __errno_location();
    PosixError((anon_unknown_1 *)&local_28,(string *)(in_RSI + 0x10018),*piVar2);
    Status::operator=((Status *)this,&local_28);
    Status::~Status(&local_28);
  }
  *(undefined4 *)(in_RSI + 0x10010) = 0xffffffff;
  return (Status)(char *)this;
}

Assistant:

Status Close() override {
    Status status = FlushBuffer();
    const int close_result = ::close(fd_);
    if (close_result < 0 && status.ok()) {
      status = PosixError(filename_, errno);
    }
    fd_ = -1;
    return status;
  }